

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox.cpp
# Opt level: O0

ostream * CMU462::operator<<(ostream *os,BBox *b)

{
  ostream *poVar1;
  BBox *b_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"BBOX(");
  poVar1 = operator<<(poVar1,&b->min);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = operator<<(poVar1,&b->max);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BBox& b) {
    return os << "BBOX(" << b.min << ", " << b.max << ")";
  }